

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O2

void __thiscall
icu_63::TaiwanCalendar::handleComputeFields
          (TaiwanCalendar *this,int32_t julianDay,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  
  GregorianCalendar::handleComputeFields(&this->super_GregorianCalendar,julianDay,status);
  iVar1 = (this->super_GregorianCalendar).super_Calendar.fFields[0x13];
  iVar2 = iVar1 + -0x777;
  if (iVar1 < 0x778) {
    iVar2 = -(iVar1 + -0x778);
  }
  (this->super_GregorianCalendar).super_Calendar.fFields[0] = (uint)(0x777 < iVar1);
  (this->super_GregorianCalendar).super_Calendar.fStamp[0] = 1;
  (this->super_GregorianCalendar).super_Calendar.fStamp[1] = 1;
  (this->super_GregorianCalendar).super_Calendar.fIsSet[0] = '\x01';
  (this->super_GregorianCalendar).super_Calendar.fIsSet[1] = '\x01';
  (this->super_GregorianCalendar).super_Calendar.fFields[1] = iVar2;
  return;
}

Assistant:

void TaiwanCalendar::handleComputeFields(int32_t julianDay, UErrorCode& status)
{
    GregorianCalendar::handleComputeFields(julianDay, status);
    int32_t y = internalGet(UCAL_EXTENDED_YEAR) - kTaiwanEraStart;
    if(y>0) {
        internalSet(UCAL_ERA, MINGUO);
        internalSet(UCAL_YEAR, y);
    } else {
        internalSet(UCAL_ERA, BEFORE_MINGUO);
        internalSet(UCAL_YEAR, 1-y);
    }
}